

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_54;
  uint local_50;
  int fVerbose;
  int fChoicing;
  int fSpeculate;
  int fProve;
  int fDoSparse;
  int nConfLimit;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fProve = 100;
  fSpeculate = 1;
  fChoicing = 0;
  fVerbose = 0;
  local_50 = 0;
  local_54 = 0;
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Csprcvh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command works only for strashed networks.\n");
        return 1;
      }
      pAVar2 = Abc_NtkDarFraig(pAVar2,fProve,fSpeculate,fChoicing,0,fVerbose,local_50,local_54);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Command has failed.\n");
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0027d23f;
      }
      fProve = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fProve < 0) {
LAB_0027d23f:
        Abc_Print(-2,"usage: dfraig [-C num] [-sprcvh]\n");
        Abc_Print(-2,"\t         performs fraiging using a new method\n");
        Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",
                  (ulong)(uint)fProve);
        pcVar3 = "no";
        if (fSpeculate != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle considering sparse functions [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (fChoicing != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-p     : toggle proving the miter outputs [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (fVerbose != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-r     : toggle speculative reduction [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (local_50 != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-c     : toggle accumulation of choices [default = %s]\n",pcVar3);
        pcVar3 = "no";
        if (local_54 != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_0027d23f;
    case 99:
      local_50 = local_50 ^ 1;
      break;
    case 0x68:
      goto LAB_0027d23f;
    case 0x70:
      fChoicing = fChoicing ^ 1;
      break;
    case 0x72:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x73:
      fSpeculate = fSpeculate ^ 1;
      break;
    case 0x76:
      local_54 = local_54 ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nConfLimit, fDoSparse, fProve, fSpeculate, fChoicing, fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fSpeculate, int fChoicing, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nConfLimit   = 100;
    fDoSparse    = 1;
    fProve       = 0;
    fSpeculate   = 0;
    fChoicing    = 0;
    fVerbose     = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Csprcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 's':
            fDoSparse ^= 1;
            break;
        case 'p':
            fProve ^= 1;
            break;
        case 'r':
            fSpeculate ^= 1;
            break;
        case 'c':
            fChoicing ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkDarFraig( pNtk, nConfLimit, fDoSparse, fProve, 0, fSpeculate, fChoicing, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dfraig [-C num] [-sprcvh]\n" );
    Abc_Print( -2, "\t         performs fraiging using a new method\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-s     : toggle considering sparse functions [default = %s]\n", fDoSparse? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle proving the miter outputs [default = %s]\n", fProve? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle speculative reduction [default = %s]\n", fSpeculate? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle accumulation of choices [default = %s]\n", fChoicing? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}